

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir_Resampler.cpp
# Opt level: O3

blargg_err_t __thiscall Fir_Resampler_::buffer_size(Fir_Resampler_ *this,int new_size)

{
  short *__s;
  char *pcVar1;
  size_t sVar2;
  
  sVar2 = (long)new_size + (long)this->write_offset;
  __s = (short *)realloc((this->buf).begin_,sVar2 * 2);
  if ((int)sVar2 == 0 || __s != (short *)0x0) {
    (this->buf).begin_ = __s;
    (this->buf).size_ = sVar2;
    this->imp_phase = 0;
    if ((int)sVar2 == 0) {
      pcVar1 = (blargg_err_t)0x0;
    }
    else {
      this->write_pos = __s + this->write_offset;
      pcVar1 = (blargg_err_t)0x0;
      memset(__s,0,(long)this->write_offset * 2);
    }
  }
  else {
    pcVar1 = "Out of memory";
  }
  return pcVar1;
}

Assistant:

blargg_err_t Fir_Resampler_::buffer_size( int new_size )
{
	RETURN_ERR( buf.resize( new_size + write_offset ) );
	clear();
	return 0;
}